

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotTesting.c
# Opt level: O0

void unitsMove(char *loadDir)

{
  UnitList *queue;
  UnitNode *target;
  long lVar1;
  uint *puVar2;
  undefined8 *puVar3;
  byte bVar4;
  undefined8 auStack_44b8 [158];
  int local_3fc4;
  undefined1 local_3fc0 [4];
  int j;
  Path path;
  Map current;
  MapList *testList;
  Dialog dialog [10];
  Inmate *inmateUnit;
  UnitList *inmates;
  char *loadDir_local;
  
  bVar4 = 0;
  current._1256_8_ = malloc(0x3164);
  parseMap(loadDir,(MapList *)current._1256_8_,(Dialog *)&testList);
  printf("Riot Levels Found %d:\n\n",(ulong)*(uint *)(current._1256_8_ + 0x3160));
  queue = (UnitList *)malloc(0x18);
  queue->count = 0;
  queue->head = (UnitNode *)0x0;
  queue->tail = (UnitNode *)0x0;
  memcpy(&path.count,(void *)(current._1256_8_ + 0xed0),0x4f0);
  puVar2 = &path.count;
  puVar3 = auStack_44b8;
  for (lVar1 = 0x9e; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *(undefined8 *)puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -4 + 2;
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  getPath(local_3fc0);
  printf("LEVEL %d: \n\n",3);
  for (local_3fc4 = 0; local_3fc4 < 0x10; local_3fc4 = local_3fc4 + 1) {
    printf("%s\n",current.overlay[(long)local_3fc4 + -1] + 0x41);
  }
  printPath((Path *)local_3fc0);
  dialog[9].textLose._492_8_ = createInmate(HOMEBOY);
  ((Inmate *)dialog[9].textLose._492_8_)->position = 693.0;
  enqueue(queue,(void *)dialog[9].textLose._492_8_);
  printf("Adding an inmate to the list (%d)\n",(ulong)(uint)queue->count);
  printf("Inmate position is: %f\n-----\n",(double)*(float *)(dialog[9].textLose._492_8_ + 4));
  putchar(10);
  while (queue->count != 0) {
    target = dequeue(queue);
    rmUnit(target);
  }
  destroyList(queue);
  return;
}

Assistant:

void unitsMove(char *loadDir) {
    struct UnitList *inmates;
    //struct UnitList *guards;
    struct Inmate *inmateUnit;
    struct Dialog dialog[MAX_LEVELS];
    struct MapList *testList = malloc(sizeof(struct MapList));
    parseMap(loadDir, testList, dialog);
    struct Map current;
    struct Path path;
    printf("Riot Levels Found %d:\n\n", testList->count);

    inmates = malloc(sizeof(struct UnitList));

    inmates->count = 0;
    inmates->head = NULL;
    inmates->tail = NULL;

    //guards = createList();
    current = testList->level[3];
    getPath(&path, current);
    printf("LEVEL %d: \n\n", 3);
    for (int j = 0; j < MAP_ROWS; j++) {
        printf("%s\n", current.overlay[j]);
    }

    printPath(&path);

    inmateUnit = createInmate(HOMEBOY);
    inmateUnit->position = 693;
    enqueue(inmates, inmateUnit);
    printf("Adding an inmate to the list (%d)\n", inmates->count);
    printf("Inmate position is: %f\n-----\n", inmateUnit->position);

    /* for (int i = 0; i < 20; ++i) {
         inmateMove(inmates, path);
     }*/
    //simulate(&gameInterface,guards, inmates, path);
    putchar('\n');

    while (inmates->count) {
        //printf("Removing units (%d)\n", inmates->count);
        rmUnit(dequeue(inmates));
    }
    //putchar('\n');

    destroyList(inmates);
}